

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeMemTranslate(Mem *pMem,u8 desiredEnc)

{
  byte bVar1;
  byte bVar2;
  undefined2 uVar3;
  ushort uVar4;
  ushort uVar5;
  int iVar6;
  ushort *puVar7;
  byte *p;
  byte *pbVar8;
  ushort *puVar9;
  long lVar10;
  uint uVar11;
  undefined7 in_register_00000031;
  byte *pbVar12;
  ushort *puVar13;
  uint uVar14;
  
  if (((int)CONCAT71(in_register_00000031,desiredEnc) == 1) || (pMem->enc == '\x01')) {
    uVar14 = pMem->n;
    if (desiredEnc == '\x01') {
      uVar14 = uVar14 & 0xfffffffe;
      pMem->n = uVar14;
      iVar6 = uVar14 * 2 + 1;
    }
    else {
      iVar6 = uVar14 * 2 + 2;
    }
    puVar7 = (ushort *)pMem->z;
    p = (byte *)sqlite3DbMallocRaw(pMem->db,(long)iVar6);
    if (p == (byte *)0x0) {
      return 7;
    }
    puVar9 = (ushort *)((long)(int)uVar14 + (long)puVar7);
    if (pMem->enc == '\x01') {
      pbVar8 = p;
      if (desiredEnc == '\x02') {
        while (puVar7 < puVar9) {
          bVar2 = (byte)*puVar7;
          puVar13 = (ushort *)((long)puVar7 + 1);
          puVar7 = puVar13;
          uVar14 = (uint)bVar2;
          if (bVar2 < 0xc0) {
LAB_0012eae3:
            *(short *)pbVar8 = (short)uVar14;
            pbVar8 = pbVar8 + 2;
          }
          else {
            uVar11 = (uint)""[bVar2 - 0xc0];
            while ((puVar7 = puVar9, puVar13 != puVar9 &&
                   (uVar5 = *puVar13, puVar7 = puVar13, ((byte)uVar5 & 0xffffffc0) == 0x80))) {
              puVar13 = (ushort *)((long)puVar13 + 1);
              uVar11 = uVar11 << 6 | (byte)uVar5 & 0x3f;
            }
            uVar14 = 0xfffd;
            if (((((uVar11 & 0xfffffffe) == 0xfffe) || (uVar11 < 0x80)) ||
                ((uVar11 & 0xfffff800) == 0xd800)) || (uVar14 = uVar11, uVar11 < 0x10000))
            goto LAB_0012eae3;
            *pbVar8 = (byte)(uVar11 - 0x10000 >> 10) & 0xc0 | (byte)(uVar11 >> 10) & 0x3f;
            pbVar8[1] = (byte)(uVar11 - 0x10000 >> 0x12) & 3 | 0xd8;
            pbVar8[2] = (byte)uVar11;
            pbVar8[3] = (byte)(uVar11 >> 8) & 3 | 0xdc;
            pbVar8 = pbVar8 + 4;
          }
        }
      }
      else {
        while (puVar7 < puVar9) {
          bVar2 = (byte)*puVar7;
          puVar13 = (ushort *)((long)puVar7 + 1);
          puVar7 = puVar13;
          uVar14 = (uint)bVar2;
          if (bVar2 < 0xc0) {
LAB_0012ed0b:
            uVar11 = uVar14;
            pbVar12 = pbVar8 + 1;
            *pbVar8 = (byte)(uVar11 >> 8);
            lVar10 = 2;
          }
          else {
            uVar11 = (uint)""[bVar2 - 0xc0];
            while ((puVar7 = puVar9, puVar13 != puVar9 &&
                   (uVar5 = *puVar13, puVar7 = puVar13, ((byte)uVar5 & 0xffffffc0) == 0x80))) {
              puVar13 = (ushort *)((long)puVar13 + 1);
              uVar11 = uVar11 << 6 | (byte)uVar5 & 0x3f;
            }
            uVar14 = 0xfffd;
            if ((((uVar11 & 0xfffffffe) == 0xfffe) || (uVar11 < 0x80)) ||
               (((uVar11 & 0xfffff800) == 0xd800 || (uVar14 = uVar11, uVar11 < 0x10000))))
            goto LAB_0012ed0b;
            *pbVar8 = (byte)(uVar11 - 0x10000 >> 0x12) & 3 | 0xd8;
            pbVar8[1] = (byte)(uVar11 - 0x10000 >> 10) & 0xc0 | (byte)(uVar11 >> 10) & 0x3f;
            pbVar12 = pbVar8 + 3;
            pbVar8[2] = (byte)(uVar11 >> 8) & 3 | 0xdc;
            lVar10 = 4;
          }
          pbVar8 = pbVar8 + lVar10;
          *pbVar12 = (byte)uVar11;
        }
      }
      pMem->n = (int)pbVar8 - (int)p;
      *pbVar8 = 0;
      pbVar8 = pbVar8 + 1;
    }
    else {
      pbVar8 = p;
      if (pMem->enc == '\x02') {
        while (puVar7 < puVar9) {
          bVar2 = (byte)*puVar7;
          puVar13 = puVar7 + 1;
          bVar1 = *(byte *)((long)puVar7 + 1);
          uVar5 = *puVar7;
          if (((bVar1 & 0xf8) == 0xd8) && (puVar13 < puVar9)) {
            uVar4 = puVar7[1];
            bVar1 = *(byte *)((long)puVar7 + 3);
            iVar6 = (uVar5 & 0x3c0) * 0x400;
            *pbVar8 = (byte)(iVar6 + 0x10000U >> 0x12) | 0xf0;
            pbVar8[1] = (byte)(iVar6 + ((uint)bVar2 << 10 & 0xf000) + 0x10000 >> 0xc) & 0x3f | 0x80;
            pbVar8[2] = (byte)(((bVar1 & 3) << 8 | (uint)(byte)uVar4 | (uint)bVar2 << 10) >> 6) &
                        0x3f | 0x80;
            pbVar8[3] = (byte)uVar4 & 0x3f | 0x80;
            pbVar8 = pbVar8 + 4;
            puVar7 = puVar7 + 2;
          }
          else {
            puVar7 = puVar13;
            if (uVar5 < 0x80) {
              *pbVar8 = bVar2;
              pbVar8 = pbVar8 + 1;
            }
            else if (bVar1 < 8) {
              *pbVar8 = (byte)(uVar5 >> 6) | 0xc0;
              pbVar8[1] = bVar2 & 0x3f | 0x80;
              pbVar8 = pbVar8 + 2;
            }
            else {
              *pbVar8 = bVar1 >> 4 | 0xe0;
              pbVar8[1] = (byte)(uVar5 >> 6) & 0x3f | 0x80;
              pbVar8[2] = bVar2 & 0x3f | 0x80;
              pbVar8 = pbVar8 + 3;
            }
          }
        }
      }
      else {
        while (puVar7 < puVar9) {
          bVar2 = (byte)*puVar7;
          puVar13 = puVar7 + 1;
          bVar1 = *(byte *)((long)puVar7 + 1);
          uVar5 = CONCAT11(bVar2,bVar1);
          if (((bVar2 & 0xf8) == 0xd8) && (puVar13 < puVar9)) {
            uVar4 = puVar7[1];
            bVar2 = *(byte *)((long)puVar7 + 3);
            iVar6 = (uVar5 & 0x3c0) * 0x400;
            *pbVar8 = (byte)(iVar6 + 0x10000U >> 0x12) | 0xf0;
            pbVar8[1] = (byte)(iVar6 + ((uint)bVar1 << 10 & 0xf000) + 0x10000 >> 0xc) & 0x3f | 0x80;
            pbVar8[2] = (byte)((((byte)uVar4 & 3) << 8 | (uint)bVar2 | (uint)bVar1 << 10) >> 6) &
                        0x3f | 0x80;
            pbVar8[3] = bVar2 & 0x3f | 0x80;
            pbVar8 = pbVar8 + 4;
            puVar7 = puVar7 + 2;
          }
          else {
            puVar7 = puVar13;
            if (uVar5 < 0x80) {
              *pbVar8 = bVar1;
              pbVar8 = pbVar8 + 1;
            }
            else if (bVar2 < 8) {
              *pbVar8 = (byte)(uVar5 >> 6) | 0xc0;
              pbVar8[1] = bVar1 & 0x3f | 0x80;
              pbVar8 = pbVar8 + 2;
            }
            else {
              *pbVar8 = bVar2 >> 4 | 0xe0;
              pbVar8[1] = (byte)(uVar5 >> 6) & 0x3f | 0x80;
              pbVar8[2] = bVar1 & 0x3f | 0x80;
              pbVar8 = pbVar8 + 3;
            }
          }
        }
      }
      pMem->n = (int)pbVar8 - (int)p;
    }
    *pbVar8 = 0;
    uVar3 = pMem->flags;
    sqlite3VdbeMemRelease(pMem);
    pMem->flags = uVar3 & 0x801d | 0x202;
    pMem->enc = desiredEnc;
    pMem->z = (char *)p;
    pMem->zMalloc = (char *)p;
    iVar6 = sqlite3DbMallocSize(pMem->db,p);
    pMem->szMalloc = iVar6;
  }
  else {
    iVar6 = sqlite3VdbeMemMakeWriteable(pMem);
    if (iVar6 != 0) {
      return 7;
    }
    puVar7 = (ushort *)pMem->z;
    puVar9 = (ushort *)(((long)pMem->n & 0xfffffffffffffffeU) + (long)puVar7);
    for (; puVar7 < puVar9; puVar7 = puVar7 + 1) {
      *puVar7 = *puVar7 << 8 | *puVar7 >> 8;
    }
    pMem->enc = desiredEnc;
  }
  return 0;
}

Assistant:

int sqlite3VdbeMemTranslate(Mem *pMem, u8 desiredEnc){
  int len;                    /* Maximum length of output string in bytes */
  unsigned char *zOut;                  /* Output buffer */
  unsigned char *zIn;                   /* Input iterator */
  unsigned char *zTerm;                 /* End of input */
  unsigned char *z;                     /* Output iterator */
  unsigned int c;

  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( pMem->flags&MEM_Str );
  assert( pMem->enc!=desiredEnc );
  assert( pMem->enc!=0 );
  assert( pMem->n>=0 );

#if defined(TRANSLATE_TRACE) && defined(SQLITE_DEBUG)
  {
    char zBuf[100];
    sqlite3VdbeMemPrettyPrint(pMem, zBuf);
    fprintf(stderr, "INPUT:  %s\n", zBuf);
  }
#endif

  /* If the translation is between UTF-16 little and big endian, then 
  ** all that is required is to swap the byte order. This case is handled
  ** differently from the others.
  */
  if( pMem->enc!=SQLITE_UTF8 && desiredEnc!=SQLITE_UTF8 ){
    u8 temp;
    int rc;
    rc = sqlite3VdbeMemMakeWriteable(pMem);
    if( rc!=SQLITE_OK ){
      assert( rc==SQLITE_NOMEM );
      return SQLITE_NOMEM_BKPT;
    }
    zIn = (u8*)pMem->z;
    zTerm = &zIn[pMem->n&~1];
    while( zIn<zTerm ){
      temp = *zIn;
      *zIn = *(zIn+1);
      zIn++;
      *zIn++ = temp;
    }
    pMem->enc = desiredEnc;
    goto translate_out;
  }

  /* Set len to the maximum number of bytes required in the output buffer. */
  if( desiredEnc==SQLITE_UTF8 ){
    /* When converting from UTF-16, the maximum growth results from
    ** translating a 2-byte character to a 4-byte UTF-8 character.
    ** A single byte is required for the output string
    ** nul-terminator.
    */
    pMem->n &= ~1;
    len = pMem->n * 2 + 1;
  }else{
    /* When converting from UTF-8 to UTF-16 the maximum growth is caused
    ** when a 1-byte UTF-8 character is translated into a 2-byte UTF-16
    ** character. Two bytes are required in the output buffer for the
    ** nul-terminator.
    */
    len = pMem->n * 2 + 2;
  }

  /* Set zIn to point at the start of the input buffer and zTerm to point 1
  ** byte past the end.
  **
  ** Variable zOut is set to point at the output buffer, space obtained
  ** from sqlite3_malloc().
  */
  zIn = (u8*)pMem->z;
  zTerm = &zIn[pMem->n];
  zOut = sqlite3DbMallocRaw(pMem->db, len);
  if( !zOut ){
    return SQLITE_NOMEM_BKPT;
  }
  z = zOut;

  if( pMem->enc==SQLITE_UTF8 ){
    if( desiredEnc==SQLITE_UTF16LE ){
      /* UTF-8 -> UTF-16 Little-endian */
      while( zIn<zTerm ){
        READ_UTF8(zIn, zTerm, c);
        WRITE_UTF16LE(z, c);
      }
    }else{
      assert( desiredEnc==SQLITE_UTF16BE );
      /* UTF-8 -> UTF-16 Big-endian */
      while( zIn<zTerm ){
        READ_UTF8(zIn, zTerm, c);
        WRITE_UTF16BE(z, c);
      }
    }
    pMem->n = (int)(z - zOut);
    *z++ = 0;
  }else{
    assert( desiredEnc==SQLITE_UTF8 );
    if( pMem->enc==SQLITE_UTF16LE ){
      /* UTF-16 Little-endian -> UTF-8 */
      while( zIn<zTerm ){
        READ_UTF16LE(zIn, zIn<zTerm, c); 
        WRITE_UTF8(z, c);
      }
    }else{
      /* UTF-16 Big-endian -> UTF-8 */
      while( zIn<zTerm ){
        READ_UTF16BE(zIn, zIn<zTerm, c); 
        WRITE_UTF8(z, c);
      }
    }
    pMem->n = (int)(z - zOut);
  }
  *z = 0;
  assert( (pMem->n+(desiredEnc==SQLITE_UTF8?1:2))<=len );

  c = pMem->flags;
  sqlite3VdbeMemRelease(pMem);
  pMem->flags = MEM_Str|MEM_Term|(c&(MEM_AffMask|MEM_Subtype));
  pMem->enc = desiredEnc;
  pMem->z = (char*)zOut;
  pMem->zMalloc = pMem->z;
  pMem->szMalloc = sqlite3DbMallocSize(pMem->db, pMem->z);

translate_out:
#if defined(TRANSLATE_TRACE) && defined(SQLITE_DEBUG)
  {
    char zBuf[100];
    sqlite3VdbeMemPrettyPrint(pMem, zBuf);
    fprintf(stderr, "OUTPUT: %s\n", zBuf);
  }
#endif
  return SQLITE_OK;
}